

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

sigdata_t * it_load_sigdata(DUMBFILE *f)

{
  char cVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  int32 iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  undefined1 *__base;
  undefined4 *puVar10;
  IT_SAMPLE *in_RDI;
  bool bVar11;
  uint size_1;
  uint size;
  uint mptx_id;
  short *sample;
  IT_PATTERN *p;
  int m;
  int32 offset_1;
  int leftdigit_1;
  int j_1;
  uchar len_1;
  int leftdigit;
  int j;
  uchar len;
  int i;
  uchar mididata [32];
  int32 offset;
  uchar *buffer;
  int n;
  uchar sample_convert [4096];
  int n_components;
  IT_COMPONENT *component;
  int message_offset;
  int message_length;
  int special;
  int cmwt;
  int cwt;
  DUMB_IT_SIGDATA *sigdata;
  undefined4 in_stack_ffffffffffffeef8;
  int in_stack_ffffffffffffeefc;
  undefined4 in_stack_ffffffffffffef00;
  int32 in_stack_ffffffffffffef04;
  undefined1 in_stack_ffffffffffffef08;
  undefined1 in_stack_ffffffffffffef09;
  undefined1 uVar12;
  undefined1 in_stack_ffffffffffffef0a;
  undefined1 in_stack_ffffffffffffef0b;
  int in_stack_ffffffffffffef0c;
  uchar *in_stack_ffffffffffffef10;
  IT_SAMPLE *in_stack_ffffffffffffef18;
  int local_10dc;
  int local_10c4;
  short *local_10c0;
  int local_10ac;
  int local_10a8;
  int local_10a4;
  int local_10a0;
  byte local_1099;
  int local_1098;
  int local_1094;
  byte local_108d;
  int local_108c;
  byte local_1088 [44];
  int32 local_105c;
  void *local_1058;
  int local_104c;
  uchar *in_stack_fffffffffffff098;
  DUMBFILE *in_stack_fffffffffffff0a0;
  IT_PATTERN *in_stack_fffffffffffff0a8;
  uint local_3c;
  int local_28;
  void *local_8;
  
  iVar5 = dumbfile_mgetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
  if (iVar5 == 0x494d504d) {
    local_8 = malloc(0x138);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      *(undefined8 *)((long)local_8 + 0x48) = 0;
      *(undefined8 *)((long)local_8 + 0x100) = 0;
      *(undefined8 *)((long)local_8 + 0x110) = 0;
      *(undefined8 *)((long)local_8 + 0x118) = 0;
      *(undefined8 *)((long)local_8 + 0x120) = 0;
      *(undefined8 *)((long)local_8 + 0x128) = 0;
      *(undefined8 *)((long)local_8 + 0x130) = 0;
      dumbfile_getnc((char *)in_stack_ffffffffffffef18,
                     (int32)((ulong)in_stack_ffffffffffffef10 >> 0x20),
                     (DUMBFILE *)
                     CONCAT44(in_stack_ffffffffffffef0c,
                              CONCAT13(in_stack_ffffffffffffef0b,
                                       CONCAT12(in_stack_ffffffffffffef0a,
                                                CONCAT11(in_stack_ffffffffffffef09,
                                                         in_stack_ffffffffffffef08)))));
      *(undefined1 *)((long)local_8 + 0x1a) = 0;
      dumbfile_skip((DUMBFILE *)
                    CONCAT44(in_stack_ffffffffffffef0c,
                             CONCAT13(in_stack_ffffffffffffef0b,
                                      CONCAT12(in_stack_ffffffffffffef0a,
                                               CONCAT11(in_stack_ffffffffffffef09,
                                                        in_stack_ffffffffffffef08)))),
                    CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
      iVar6 = dumbfile_igetw((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x50) = iVar6;
      iVar6 = dumbfile_igetw((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x54) = iVar6;
      iVar6 = dumbfile_igetw((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x58) = iVar6;
      iVar6 = dumbfile_igetw((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x5c) = iVar6;
      dumbfile_igetw((DUMBFILE *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      iVar6 = dumbfile_igetw((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      iVar7 = dumbfile_igetw((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 100) = iVar7;
      uVar8 = dumbfile_igetw((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      iVar7 = dumbfile_getc((DUMBFILE *)
                            CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x68) = iVar7;
      iVar7 = dumbfile_getc((DUMBFILE *)
                            CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x6c) = iVar7;
      iVar7 = dumbfile_getc((DUMBFILE *)
                            CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x70) = iVar7;
      if (*(int *)((long)local_8 + 0x70) == 0) {
        *(undefined4 *)((long)local_8 + 0x70) = 6;
      }
      iVar7 = dumbfile_getc((DUMBFILE *)
                            CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x74) = iVar7;
      iVar7 = dumbfile_getc((DUMBFILE *)
                            CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      *(int *)((long)local_8 + 0x78) = iVar7;
      dumbfile_skip((DUMBFILE *)
                    CONCAT44(in_stack_ffffffffffffef0c,
                             CONCAT13(in_stack_ffffffffffffef0b,
                                      CONCAT12(in_stack_ffffffffffffef0a,
                                               CONCAT11(in_stack_ffffffffffffef09,
                                                        in_stack_ffffffffffffef08)))),
                    CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
      local_28 = dumbfile_igetw((DUMBFILE *)
                                CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      iVar5 = dumbfile_igetl((DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
      dumbfile_skip((DUMBFILE *)
                    CONCAT44(in_stack_ffffffffffffef0c,
                             CONCAT13(in_stack_ffffffffffffef0b,
                                      CONCAT12(in_stack_ffffffffffffef0a,
                                               CONCAT11(in_stack_ffffffffffffef09,
                                                        in_stack_ffffffffffffef08)))),
                    CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
      dumbfile_getnc((char *)in_stack_ffffffffffffef18,
                     (int32)((ulong)in_stack_ffffffffffffef10 >> 0x20),
                     (DUMBFILE *)
                     CONCAT44(in_stack_ffffffffffffef0c,
                              CONCAT13(in_stack_ffffffffffffef0b,
                                       CONCAT12(in_stack_ffffffffffffef0a,
                                                CONCAT11(in_stack_ffffffffffffef09,
                                                         in_stack_ffffffffffffef08)))));
      dumbfile_getnc((char *)in_stack_ffffffffffffef18,
                     (int32)((ulong)in_stack_ffffffffffffef10 >> 0x20),
                     (DUMBFILE *)
                     CONCAT44(in_stack_ffffffffffffef0c,
                              CONCAT13(in_stack_ffffffffffffef0b,
                                       CONCAT12(in_stack_ffffffffffffef0a,
                                                CONCAT11(in_stack_ffffffffffffef09,
                                                         in_stack_ffffffffffffef08)))));
      iVar7 = dumbfile_error((DUMBFILE *)in_RDI);
      if ((((iVar7 == 0) && (0 < *(int *)((long)local_8 + 0x50))) &&
          (*(int *)((long)local_8 + 0x54) < 0x101)) &&
         ((*(int *)((long)local_8 + 0x58) < 0xfa1 && (*(int *)((long)local_8 + 0x5c) < 0x101)))) {
        pvVar9 = malloc((long)*(int *)((long)local_8 + 0x50));
        *(void **)((long)local_8 + 0x100) = pvVar9;
        if (*(long *)((long)local_8 + 0x100) == 0) {
          _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
          local_8 = (void *)0x0;
        }
        else {
          if (*(int *)((long)local_8 + 0x54) != 0) {
            pvVar9 = malloc((long)*(int *)((long)local_8 + 0x54) * 0x29c);
            *(void **)((long)local_8 + 0x110) = pvVar9;
            if (*(long *)((long)local_8 + 0x110) == 0) {
              _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
              return (sigdata_t *)0x0;
            }
          }
          if (*(int *)((long)local_8 + 0x58) != 0) {
            pvVar9 = malloc((long)*(int *)((long)local_8 + 0x58) * 0x68);
            *(void **)((long)local_8 + 0x118) = pvVar9;
            if (*(long *)((long)local_8 + 0x118) == 0) {
              _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
              return (sigdata_t *)0x0;
            }
            for (local_104c = 0; local_104c < *(int *)((long)local_8 + 0x58);
                local_104c = local_104c + 1) {
              *(undefined8 *)(*(long *)((long)local_8 + 0x118) + (long)local_104c * 0x68 + 0x58) = 0
              ;
            }
          }
          if (*(int *)((long)local_8 + 0x5c) != 0) {
            pvVar9 = malloc((long)*(int *)((long)local_8 + 0x5c) << 4);
            *(void **)((long)local_8 + 0x120) = pvVar9;
            if (*(long *)((long)local_8 + 0x120) == 0) {
              _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
              return (sigdata_t *)0x0;
            }
            for (local_104c = 0; local_104c < *(int *)((long)local_8 + 0x5c);
                local_104c = local_104c + 1) {
              *(undefined8 *)(*(long *)((long)local_8 + 0x120) + (long)local_104c * 0x10 + 8) = 0;
            }
          }
          dumbfile_getnc((char *)in_stack_ffffffffffffef18,
                         (int32)((ulong)in_stack_ffffffffffffef10 >> 0x20),
                         (DUMBFILE *)
                         CONCAT44(in_stack_ffffffffffffef0c,
                                  CONCAT13(in_stack_ffffffffffffef0b,
                                           CONCAT12(in_stack_ffffffffffffef0a,
                                                    CONCAT11(in_stack_ffffffffffffef09,
                                                             in_stack_ffffffffffffef08)))));
          *(undefined1 *)((long)local_8 + 0x108) = 0;
          __base = (undefined1 *)malloc(0x240c);
          if (__base == (undefined1 *)0x0) {
            _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
            local_8 = (void *)0x0;
          }
          else {
            bVar11 = (uVar8 & 1) != 0;
            if (bVar11) {
              *__base = 1;
              *(int32 *)(__base + 4) = iVar5;
              *(undefined2 *)(__base + 8) = 0xffff;
            }
            local_3c = (uint)bVar11;
            for (local_104c = 0; local_104c < *(int *)((long)local_8 + 0x54);
                local_104c = local_104c + 1) {
              __base[(long)(int)local_3c * 0xc] = 2;
              *(short *)(__base + (long)(int)local_3c * 0xc + 2) = (short)local_104c;
              iVar5 = dumbfile_igetl((DUMBFILE *)
                                     CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
              *(int32 *)(__base + (long)(int)local_3c * 0xc + 4) = iVar5;
              *(undefined2 *)(__base + (long)(int)local_3c * 0xc + 8) = 0xffff;
              local_3c = local_3c + 1;
            }
            for (local_104c = 0; local_104c < *(int *)((long)local_8 + 0x58);
                local_104c = local_104c + 1) {
              __base[(long)(int)local_3c * 0xc] = 4;
              *(short *)(__base + (long)(int)local_3c * 0xc + 2) = (short)local_104c;
              iVar5 = dumbfile_igetl((DUMBFILE *)
                                     CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
              *(int32 *)(__base + (long)(int)local_3c * 0xc + 4) = iVar5;
              *(undefined2 *)(__base + (long)(int)local_3c * 0xc + 8) = 0xffff;
              local_3c = local_3c + 1;
            }
            for (local_104c = 0; local_104c < *(int *)((long)local_8 + 0x5c);
                local_104c = local_104c + 1) {
              local_105c = dumbfile_igetl((DUMBFILE *)
                                          CONCAT44(in_stack_ffffffffffffeefc,
                                                   in_stack_ffffffffffffeef8));
              if (local_105c == 0) {
                *(undefined4 *)(*(long *)((long)local_8 + 0x120) + (long)local_104c * 0x10) = 0x40;
                *(undefined4 *)(*(long *)((long)local_8 + 0x120) + (long)local_104c * 0x10 + 4) = 0;
              }
              else {
                __base[(long)(int)local_3c * 0xc] = 3;
                *(short *)(__base + (long)(int)local_3c * 0xc + 2) = (short)local_104c;
                *(int32 *)(__base + (long)(int)local_3c * 0xc + 4) = local_105c;
                *(undefined2 *)(__base + (long)(int)local_3c * 0xc + 8) = 0xffff;
                local_3c = local_3c + 1;
              }
            }
            iVar7 = dumbfile_error((DUMBFILE *)in_RDI);
            if (iVar7 == 0) {
              if ((uVar8 & 8) != 0) {
                pvVar9 = malloc(0x9b0);
                *(void **)((long)local_8 + 0x128) = pvVar9;
                if (*(long *)((long)local_8 + 0x128) == 0) {
                  free(__base);
                  _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                  return (sigdata_t *)0x0;
                }
                dumbfile_igetw((DUMBFILE *)
                               CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
                iVar7 = dumbfile_error((DUMBFILE *)in_RDI);
                if ((iVar7 != 0) ||
                   (iVar7 = dumbfile_skip((DUMBFILE *)
                                          CONCAT44(in_stack_ffffffffffffef0c,
                                                   CONCAT13(in_stack_ffffffffffffef0b,
                                                            CONCAT12(in_stack_ffffffffffffef0a,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffef09,
                                                  in_stack_ffffffffffffef08)))),
                                          CONCAT44(in_stack_ffffffffffffef04,
                                                   in_stack_ffffffffffffef00)), iVar7 != 0)) {
                  free(__base);
                  _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                  return (sigdata_t *)0x0;
                }
                iVar7 = dumbfile_skip((DUMBFILE *)
                                      CONCAT44(in_stack_ffffffffffffef0c,
                                               CONCAT13(in_stack_ffffffffffffef0b,
                                                        CONCAT12(in_stack_ffffffffffffef0a,
                                                                 CONCAT11(in_stack_ffffffffffffef09,
                                                                          in_stack_ffffffffffffef08)
                                                                ))),
                                      CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00))
                ;
                if (iVar7 != 0) {
                  free(__base);
                  _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                  return (sigdata_t *)0x0;
                }
                for (local_108c = 0; local_108c < 0x10; local_108c = local_108c + 1) {
                  local_108d = 0;
                  local_1098 = -1;
                  iVar5 = dumbfile_getnc((char *)in_stack_ffffffffffffef18,
                                         (int32)((ulong)in_stack_ffffffffffffef10 >> 0x20),
                                         (DUMBFILE *)
                                         CONCAT44(in_stack_ffffffffffffef0c,
                                                  CONCAT13(in_stack_ffffffffffffef0b,
                                                           CONCAT12(in_stack_ffffffffffffef0a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffef09,
                                                  in_stack_ffffffffffffef08)))));
                  if (iVar5 < 0x20) {
                    free(__base);
                    _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                    return (sigdata_t *)0x0;
                  }
                  *(undefined2 *)(*(long *)((long)local_8 + 0x128) + 0x110 + (long)local_108c * 2) =
                       0;
                  for (local_1094 = 0; local_1094 < 0x20; local_1094 = local_1094 + 1) {
                    if (local_1098 < 0) {
                      if (local_1088[local_1094] == 0) break;
                      if (local_1088[local_1094] == 0x7a) {
                        *(ushort *)(*(long *)((long)local_8 + 0x128) + 0x110 + (long)local_108c * 2)
                             = *(ushort *)
                                (*(long *)((long)local_8 + 0x128) + 0x110 + (long)local_108c * 2) |
                               (ushort)(1 << (local_108d & 0x1f));
                        local_108d = local_108d + 1;
                      }
                      else if ((local_1088[local_1094] < 0x30) || (0x39 < local_1088[local_1094])) {
                        if ((0x40 < local_1088[local_1094]) && (local_1088[local_1094] < 0x47)) {
                          local_1098 = local_1088[local_1094] - 0x37;
                        }
                      }
                      else {
                        local_1098 = local_1088[local_1094] - 0x30;
                      }
                    }
                    else {
                      if (local_1088[local_1094] == 0) {
                        *(char *)(*(long *)((long)local_8 + 0x128) + (long)local_108c * 0x10 +
                                 (ulong)local_108d) = (char)local_1098;
                        local_108d = local_108d + 1;
                        break;
                      }
                      if (local_1088[local_1094] == 0x20) {
                        *(char *)(*(long *)((long)local_8 + 0x128) + (long)local_108c * 0x10 +
                                 (ulong)local_108d) = (char)local_1098;
                        local_108d = local_108d + 1;
                      }
                      else if ((local_1088[local_1094] < 0x30) || (0x39 < local_1088[local_1094])) {
                        if ((0x40 < local_1088[local_1094]) && (local_1088[local_1094] < 0x47)) {
                          *(byte *)(*(long *)((long)local_8 + 0x128) + (long)local_108c * 0x10 +
                                   (ulong)local_108d) =
                               (byte)(local_1098 << 4) | local_1088[local_1094] - 0x37;
                          local_108d = local_108d + 1;
                        }
                      }
                      else {
                        *(byte *)(*(long *)((long)local_8 + 0x128) + (long)local_108c * 0x10 +
                                 (ulong)local_108d) =
                             (byte)(local_1098 << 4) | local_1088[local_1094] - 0x30;
                        local_108d = local_108d + 1;
                      }
                      local_1098 = -1;
                    }
                  }
                  *(byte *)(*(long *)((long)local_8 + 0x128) + 0x100 + (long)local_108c) =
                       local_108d;
                }
                for (local_108c = 0; local_108c < 0x80; local_108c = local_108c + 1) {
                  local_1099 = 0;
                  local_10a4 = -1;
                  dumbfile_getnc((char *)in_stack_ffffffffffffef18,
                                 (int32)((ulong)in_stack_ffffffffffffef10 >> 0x20),
                                 (DUMBFILE *)
                                 CONCAT44(in_stack_ffffffffffffef0c,
                                          CONCAT13(in_stack_ffffffffffffef0b,
                                                   CONCAT12(in_stack_ffffffffffffef0a,
                                                            CONCAT11(in_stack_ffffffffffffef09,
                                                                     in_stack_ffffffffffffef08)))));
                  for (local_10a0 = 0; local_10a0 < 0x20; local_10a0 = local_10a0 + 1) {
                    if (local_10a4 < 0) {
                      if (local_1088[local_10a0] == 0) break;
                      if ((local_1088[local_10a0] < 0x30) || (0x39 < local_1088[local_10a0])) {
                        if ((0x40 < local_1088[local_10a0]) && (local_1088[local_10a0] < 0x47)) {
                          local_10a4 = local_1088[local_10a0] - 0x37;
                        }
                      }
                      else {
                        local_10a4 = local_1088[local_10a0] - 0x30;
                      }
                    }
                    else {
                      if (local_1088[local_10a0] == 0) {
                        *(char *)(*(long *)((long)local_8 + 0x128) + 0x130 + (long)local_108c * 0x10
                                 + (ulong)local_1099) = (char)local_10a4;
                        local_1099 = local_1099 + 1;
                        break;
                      }
                      if (local_1088[local_10a0] == 0x20) {
                        *(char *)(*(long *)((long)local_8 + 0x128) + 0x130 + (long)local_108c * 0x10
                                 + (ulong)local_1099) = (char)local_10a4;
                        local_1099 = local_1099 + 1;
                      }
                      else if ((local_1088[local_10a0] < 0x30) || (0x39 < local_1088[local_10a0])) {
                        if ((0x40 < local_1088[local_10a0]) && (local_1088[local_10a0] < 0x47)) {
                          *(byte *)(*(long *)((long)local_8 + 0x128) + 0x130 +
                                    (long)local_108c * 0x10 + (ulong)local_1099) =
                               (byte)(local_10a4 << 4) | local_1088[local_10a0] - 0x37;
                          local_1099 = local_1099 + 1;
                        }
                      }
                      else {
                        *(byte *)(*(long *)((long)local_8 + 0x128) + 0x130 + (long)local_108c * 0x10
                                 + (ulong)local_1099) =
                             (byte)(local_10a4 << 4) | local_1088[local_10a0] - 0x30;
                        local_1099 = local_1099 + 1;
                      }
                      local_10a4 = -1;
                    }
                  }
                  *(byte *)(*(long *)((long)local_8 + 0x128) + 0x930 + (long)local_108c) =
                       local_1099;
                }
              }
              *(uint *)((long)local_8 + 100) = *(uint *)((long)local_8 + 100) & 0x3f;
              qsort(__base,(long)(int)local_3c,0xc,it_component_compare);
              local_1058 = malloc(0x10000);
              if (local_1058 == (void *)0x0) {
                free(__base);
                _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                local_8 = (void *)0x0;
              }
              else {
                for (local_104c = 0; local_104c < (int)local_3c; local_104c = local_104c + 1) {
                  if (*(int *)(__base + (long)local_104c * 0xc + 4) == 0) {
                    cVar1 = __base[(long)local_104c * 0xc];
                    if (cVar1 == '\x02') {
                      memset((void *)(*(long *)((long)local_8 + 0x110) +
                                     (ulong)*(ushort *)(__base + (long)local_104c * 0xc + 2) * 0x29c
                                     ),0,0x29c);
                    }
                    else if (cVar1 == '\x03') {
                      puVar10 = (undefined4 *)
                                (*(long *)((long)local_8 + 0x120) +
                                (ulong)*(ushort *)(__base + (long)local_104c * 0xc + 2) * 0x10);
                      *(undefined8 *)(puVar10 + 2) = 0;
                      *puVar10 = 0x40;
                      puVar10[1] = 0;
                    }
                    else if (cVar1 == '\x04') {
                      memset((void *)(*(long *)((long)local_8 + 0x118) +
                                     (ulong)*(ushort *)(__base + (long)local_104c * 0xc + 2) * 0x68)
                             ,0,0x68);
                    }
                  }
                  else {
                    iVar7 = dumbfile_seek((DUMBFILE *)
                                          CONCAT44(in_stack_ffffffffffffef04,
                                                   in_stack_ffffffffffffef00),
                                          CONCAT44(in_stack_ffffffffffffeefc,
                                                   in_stack_ffffffffffffeef8),0);
                    if (iVar7 != 0) {
                      free(local_1058);
                      free(__base);
                      _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                      return (sigdata_t *)0x0;
                    }
                    switch(__base[(long)local_104c * 0xc]) {
                    case 1:
                      if (local_104c < (int)local_3c) {
                        if (local_28 <
                            *(int *)(__base + (long)(local_104c + 1) * 0xc + 4) -
                            *(int *)(__base + (long)local_104c * 0xc + 4)) {
                          local_10dc = local_28;
                        }
                        else {
                          local_10dc = *(int *)(__base + (long)(local_104c + 1) * 0xc + 4) -
                                       *(int *)(__base + (long)local_104c * 0xc + 4);
                        }
                        local_28 = local_10dc;
                      }
                      pvVar9 = malloc((long)(local_28 + 1));
                      *(void **)((long)local_8 + 0x48) = pvVar9;
                      if (*(long *)((long)local_8 + 0x48) != 0) {
                        iVar5 = dumbfile_getnc((char *)in_stack_ffffffffffffef18,
                                               (int32)((ulong)in_stack_ffffffffffffef10 >> 0x20),
                                               (DUMBFILE *)
                                               CONCAT44(in_stack_ffffffffffffef0c,
                                                        CONCAT13(in_stack_ffffffffffffef0b,
                                                                 CONCAT12(in_stack_ffffffffffffef0a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffef09,
                                                  in_stack_ffffffffffffef08)))));
                        if (iVar5 < local_28) {
                          free(local_1058);
                          free(__base);
                          _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                          return (sigdata_t *)0x0;
                        }
                        *(undefined1 *)(*(long *)((long)local_8 + 0x48) + (long)local_28) = 0;
                      }
                      break;
                    case 2:
                      if (iVar6 < 0x200) {
                        local_10ac = it_read_old_instrument
                                               ((IT_INSTRUMENT *)
                                                CONCAT44(in_stack_ffffffffffffef0c,
                                                         CONCAT13(in_stack_ffffffffffffef0b,
                                                                  CONCAT12(in_stack_ffffffffffffef0a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffef09,
                                                  in_stack_ffffffffffffef08)))),
                                                (DUMBFILE *)
                                                CONCAT44(in_stack_ffffffffffffef04,
                                                         in_stack_ffffffffffffef00));
                      }
                      else {
                        in_stack_ffffffffffffef10 =
                             (uchar *)(*(long *)((long)local_8 + 0x110) +
                                      (ulong)*(ushort *)(__base + (long)local_104c * 0xc + 2) *
                                      0x29c);
                        if (local_104c + 1 < (int)local_3c) {
                          in_stack_ffffffffffffef0c =
                               *(int *)(__base + (long)(local_104c + 1) * 0xc + 4) -
                               *(int *)(__base + (long)local_104c * 0xc + 4);
                        }
                        else {
                          in_stack_ffffffffffffef0c = 0;
                        }
                        in_stack_ffffffffffffef18 = in_RDI;
                        local_10ac = it_read_instrument((IT_INSTRUMENT *)
                                                        CONCAT44(in_stack_ffffffffffffef0c,
                                                                 CONCAT13(in_stack_ffffffffffffef0b,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffef0a,
                                                  CONCAT11(in_stack_ffffffffffffef09,
                                                           in_stack_ffffffffffffef08)))),
                                                  (DUMBFILE *)
                                                  CONCAT44(in_stack_ffffffffffffef04,
                                                           in_stack_ffffffffffffef00),
                                                  in_stack_ffffffffffffeefc);
                      }
                      if (local_10ac != 0) {
                        free(local_1058);
                        free(__base);
                        _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                        return (sigdata_t *)0x0;
                      }
                      break;
                    case 3:
                      iVar7 = it_read_pattern(in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                                              in_stack_fffffffffffff098);
                      if (iVar7 != 0) {
                        free(local_1058);
                        free(__base);
                        _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                        return (sigdata_t *)0x0;
                      }
                      break;
                    case 4:
                      iVar7 = it_read_sample_header
                                        (in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                                         (int32 *)CONCAT44(in_stack_ffffffffffffef0c,
                                                           CONCAT13(in_stack_ffffffffffffef0b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffef0a,
                                                  CONCAT11(in_stack_ffffffffffffef09,
                                                           in_stack_ffffffffffffef08)))),
                                         (DUMBFILE *)
                                         CONCAT44(in_stack_ffffffffffffef04,
                                                  in_stack_ffffffffffffef00));
                      if (iVar7 != 0) {
                        free(local_1058);
                        free(__base);
                        _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                        return (sigdata_t *)0x0;
                      }
                      iVar7 = local_104c;
                      if ((*(byte *)(*(long *)((long)local_8 + 0x118) +
                                     (ulong)*(ushort *)(__base + (long)local_104c * 0xc + 2) * 0x68
                                    + 0x32) & 1) != 0) {
                        do {
                          iVar3 = iVar7;
                          local_10ac = iVar3 + 1;
                          if ((int)local_3c <= local_10ac) break;
                          iVar7 = local_10ac;
                        } while (*(int *)(__base + (long)local_10ac * 0xc + 4) <= local_10a8);
                        lVar4 = (long)iVar3 * 0xc + 8;
                        while( true ) {
                          local_10c0 = (short *)(__base + lVar4);
                          bVar11 = false;
                          if (-1 < *local_10c0) {
                            bVar11 = *(int *)(__base + (long)*local_10c0 * 0xc + 4) <= local_10a8;
                          }
                          if (!bVar11) break;
                          lVar4 = (long)*local_10c0 * 0xc + 10;
                        }
                        *(short *)(__base + (long)local_104c * 0xc + 10) = *local_10c0;
                        *local_10c0 = (short)local_104c;
                        *(int *)(__base + (long)local_104c * 0xc + 4) = local_10a8;
                        in_stack_ffffffffffffef0b = 0;
                      }
                    }
                    sVar2 = *(short *)(__base + (long)local_104c * 0xc + 8);
                    while (local_10ac = (int)sVar2, -1 < local_10ac) {
                      iVar7 = dumbfile_seek((DUMBFILE *)
                                            CONCAT44(in_stack_ffffffffffffef04,
                                                     in_stack_ffffffffffffef00),
                                            CONCAT44(in_stack_ffffffffffffeefc,
                                                     in_stack_ffffffffffffeef8),0);
                      if (iVar7 != 0) {
                        free(local_1058);
                        free(__base);
                        _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                        return (sigdata_t *)0x0;
                      }
                      iVar5 = it_read_sample_data((IT_SAMPLE *)
                                                  CONCAT44(in_stack_ffffffffffffef0c,
                                                           CONCAT13(in_stack_ffffffffffffef0b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffef0a,
                                                  CONCAT11(in_stack_ffffffffffffef09,
                                                           in_stack_ffffffffffffef08)))),
                                                  (uchar)((uint)in_stack_ffffffffffffef04 >> 0x18),
                                                  (DUMBFILE *)
                                                  CONCAT44(in_stack_ffffffffffffeefc,
                                                           in_stack_ffffffffffffeef8));
                      if (iVar5 != 0) {
                        free(local_1058);
                        free(__base);
                        _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
                        return (sigdata_t *)0x0;
                      }
                      sVar2 = *(short *)(__base + (long)local_10ac * 0xc + 10);
                    }
                  }
                }
                local_104c = 0;
                while ((local_104c < 10 &&
                       ((((iVar6 = dumbfile_getc((DUMBFILE *)
                                                 CONCAT44(in_stack_ffffffffffffeefc,
                                                          in_stack_ffffffffffffeef8)), iVar6 != 0x58
                          || (iVar6 = dumbfile_getc((DUMBFILE *)
                                                    CONCAT44(in_stack_ffffffffffffeefc,
                                                             in_stack_ffffffffffffeef8)),
                             iVar6 != 0x54)) ||
                         (iVar6 = dumbfile_getc((DUMBFILE *)
                                                CONCAT44(in_stack_ffffffffffffeefc,
                                                         in_stack_ffffffffffffeef8)), iVar6 != 0x50)
                         ) || (iVar6 = dumbfile_getc((DUMBFILE *)
                                                     CONCAT44(in_stack_ffffffffffffeefc,
                                                              in_stack_ffffffffffffeef8)),
                              iVar6 != 0x4d))))) {
                  local_104c = local_104c + 1;
                }
                iVar6 = dumbfile_error((DUMBFILE *)in_RDI);
                if ((iVar6 == 0) && (local_104c < 10)) {
                  local_10c4 = dumbfile_igetl((DUMBFILE *)
                                              CONCAT44(in_stack_ffffffffffffeefc,
                                                       in_stack_ffffffffffffeef8));
                  while( true ) {
                    iVar6 = dumbfile_error((DUMBFILE *)in_RDI);
                    in_stack_ffffffffffffef0a = iVar6 == 0 && local_10c4 != 0x4d505453;
                    if (iVar6 != 0 || local_10c4 == 0x4d505453) break;
                    dumbfile_igetw((DUMBFILE *)
                                   CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
                    dumbfile_skip((DUMBFILE *)
                                  CONCAT44(in_stack_ffffffffffffef0c,
                                           CONCAT13(in_stack_ffffffffffffef0b,
                                                    CONCAT12(in_stack_ffffffffffffef0a,
                                                             CONCAT11(in_stack_ffffffffffffef09,
                                                                      in_stack_ffffffffffffef08)))),
                                  CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
                    local_10c4 = dumbfile_igetl((DUMBFILE *)
                                                CONCAT44(in_stack_ffffffffffffeefc,
                                                         in_stack_ffffffffffffeef8));
                  }
                  local_10c4 = dumbfile_igetl((DUMBFILE *)
                                              CONCAT44(in_stack_ffffffffffffeefc,
                                                       in_stack_ffffffffffffeef8));
                  while( true ) {
                    iVar6 = dumbfile_error((DUMBFILE *)in_RDI);
                    uVar12 = false;
                    if (iVar6 == 0) {
                      in_stack_ffffffffffffef04 = dumbfile_pos((DUMBFILE *)in_RDI);
                      iVar5 = dumbfile_get_size((DUMBFILE *)0x9c01bd);
                      uVar12 = in_stack_ffffffffffffef04 < iVar5;
                    }
                    if ((bool)uVar12 == false) break;
                    iVar6 = dumbfile_igetw((DUMBFILE *)
                                           CONCAT44(in_stack_ffffffffffffeefc,
                                                    in_stack_ffffffffffffeef8));
                    if (local_10c4 == 0x44542e2e) {
                      if (iVar6 == 2) {
                        iVar6 = dumbfile_igetw((DUMBFILE *)
                                               CONCAT44(in_stack_ffffffffffffeefc,
                                                        in_stack_ffffffffffffeef8));
                        *(int *)((long)local_8 + 0x74) = iVar6;
                      }
                      else if (iVar6 == 4) {
                        iVar5 = dumbfile_igetl((DUMBFILE *)
                                               CONCAT44(in_stack_ffffffffffffeefc,
                                                        in_stack_ffffffffffffeef8));
                        *(int32 *)((long)local_8 + 0x74) = iVar5;
                      }
                    }
                    else {
                      dumbfile_skip((DUMBFILE *)
                                    CONCAT44(in_stack_ffffffffffffef0c,
                                             CONCAT13(in_stack_ffffffffffffef0b,
                                                      CONCAT12(in_stack_ffffffffffffef0a,
                                                               CONCAT11(uVar12,
                                                  in_stack_ffffffffffffef08)))),
                                    CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
                    }
                    local_10c4 = dumbfile_igetl((DUMBFILE *)
                                                CONCAT44(in_stack_ffffffffffffeefc,
                                                         in_stack_ffffffffffffeef8));
                  }
                  in_stack_ffffffffffffef09 = 0;
                }
                free(local_1058);
                free(__base);
                _dumb_it_fix_invalid_orders
                          ((DUMB_IT_SIGDATA *)
                           CONCAT44(in_stack_ffffffffffffef0c,
                                    CONCAT13(in_stack_ffffffffffffef0b,
                                             CONCAT12(in_stack_ffffffffffffef0a,
                                                      CONCAT11(in_stack_ffffffffffffef09,
                                                               in_stack_ffffffffffffef08)))));
              }
            }
            else {
              free(__base);
              _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
              local_8 = (void *)0x0;
            }
          }
        }
      }
      else {
        _dumb_it_unload_sigdata(in_stack_ffffffffffffef10);
        local_8 = (void *)0x0;
      }
    }
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static sigdata_t *it_load_sigdata(DUMBFILE *f)
{
	DUMB_IT_SIGDATA *sigdata;

	int cwt, cmwt;
	int special;
	int message_length, message_offset;

	IT_COMPONENT *component;
	int n_components = 0;

	unsigned char sample_convert[4096];

	int n;

	unsigned char *buffer;

	if (dumbfile_mgetl(f) != IT_SIGNATURE)
    {
		return NULL;
    }

	sigdata = malloc(sizeof(*sigdata));

	if (!sigdata)
    {
		return NULL;
    }

	sigdata->song_message = NULL;
	sigdata->order = NULL;
	sigdata->instrument = NULL;
	sigdata->sample = NULL;
	sigdata->pattern = NULL;
	sigdata->midi = NULL;
	sigdata->checkpoint = NULL;

    dumbfile_getnc((char *)sigdata->name, 26, f);
	sigdata->name[26] = 0;

	/* Skip pattern row highlight info. */
	dumbfile_skip(f, 2);

	sigdata->n_orders = dumbfile_igetw(f);
	sigdata->n_instruments = dumbfile_igetw(f);
	sigdata->n_samples = dumbfile_igetw(f);
	sigdata->n_patterns = dumbfile_igetw(f);

	cwt = dumbfile_igetw(f);
	cmwt = dumbfile_igetw(f);

	sigdata->flags = dumbfile_igetw(f);
	special = dumbfile_igetw(f);

	sigdata->global_volume = dumbfile_getc(f);
	sigdata->mixing_volume = dumbfile_getc(f);
	sigdata->speed = dumbfile_getc(f);
	if (sigdata->speed == 0) sigdata->speed = 6; // Should we? What about tempo?
	sigdata->tempo = dumbfile_getc(f);
	sigdata->pan_separation = dumbfile_getc(f); /** WARNING: use this */

	/* Skip Pitch Wheel Depth */
	dumbfile_skip(f, 1);

	message_length = dumbfile_igetw(f);
	message_offset = dumbfile_igetl(f);

	/* Skip Reserved. */
	dumbfile_skip(f, 4);

    dumbfile_getnc((char *)sigdata->channel_pan, DUMB_IT_N_CHANNELS, f);
    dumbfile_getnc((char *)sigdata->channel_volume, DUMB_IT_N_CHANNELS, f);

	// XXX sample count
	if (dumbfile_error(f) || sigdata->n_orders <= 0 || sigdata->n_instruments > 256 || sigdata->n_samples > 4000 || sigdata->n_patterns > 256) {
		_dumb_it_unload_sigdata(sigdata);
		return NULL;
	}

	sigdata->order = malloc(sigdata->n_orders);
	if (!sigdata->order) {
		_dumb_it_unload_sigdata(sigdata);
		return NULL;
	}

	if (sigdata->n_instruments) {
		sigdata->instrument = malloc(sigdata->n_instruments * sizeof(*sigdata->instrument));
		if (!sigdata->instrument) {
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}
	}

	if (sigdata->n_samples) {
		sigdata->sample = malloc(sigdata->n_samples * sizeof(*sigdata->sample));
		if (!sigdata->sample) {
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}
		for (n = 0; n < sigdata->n_samples; n++)
			sigdata->sample[n].data = NULL;
	}

	if (sigdata->n_patterns) {
		sigdata->pattern = malloc(sigdata->n_patterns * sizeof(*sigdata->pattern));
		if (!sigdata->pattern) {
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}
		for (n = 0; n < sigdata->n_patterns; n++)
			sigdata->pattern[n].entry = NULL;
	}

    dumbfile_getnc((char *)sigdata->order, sigdata->n_orders, f);
	sigdata->restart_position = 0;

	component = malloc(769 * sizeof(*component));
	if (!component) {
		_dumb_it_unload_sigdata(sigdata);
		return NULL;
	}

	if (special & 1) {
		component[n_components].type = IT_COMPONENT_SONG_MESSAGE;
		component[n_components].offset = message_offset;
		component[n_components].sampfirst = -1;
		n_components++;
	}

	for (n = 0; n < sigdata->n_instruments; n++) {
		component[n_components].type = IT_COMPONENT_INSTRUMENT;
		component[n_components].n = n;
		component[n_components].offset = dumbfile_igetl(f);
		component[n_components].sampfirst = -1;
		n_components++;
	}

	for (n = 0; n < sigdata->n_samples; n++) {
		component[n_components].type = IT_COMPONENT_SAMPLE;
		component[n_components].n = n;
		component[n_components].offset = dumbfile_igetl(f);
		component[n_components].sampfirst = -1;
		n_components++;
	}

	for (n = 0; n < sigdata->n_patterns; n++) {
		int32 offset = dumbfile_igetl(f);
		if (offset) {
			component[n_components].type = IT_COMPONENT_PATTERN;
			component[n_components].n = n;
			component[n_components].offset = offset;
			component[n_components].sampfirst = -1;
			n_components++;
		} else {
			/* Empty 64-row pattern */
			sigdata->pattern[n].n_rows = 64;
			sigdata->pattern[n].n_entries = 0;
		}
	}

	if (dumbfile_error(f)) {
		free(component);
		_dumb_it_unload_sigdata(sigdata);
		return NULL;
	}

	/*
	if (!(sigdata->flags & 128) != !(special & 8)) {
		fprintf(stderr, "Flags   Bit 7 (\"Request embedded MIDI configuration\"): %s\n", sigdata->flags & 128 ? "=SET=" : "clear");
		fprintf(stderr, "Special Bit 3     (\"MIDI configuration embedded\")    : %s\n", special        &   8 ? "=SET=" : "clear");
		fprintf(stderr, "entheh would like to investigate this IT file.\n");
		fprintf(stderr, "Please contact him! entheh@users.sf.net\n");
	}
	*/

	if (special & 8) {
		/* MIDI configuration is embedded. */
		unsigned char mididata[32];
		int i;
		sigdata->midi = malloc(sizeof(*sigdata->midi));
		if (!sigdata->midi) {
			free(component);
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
			// Should we be happy with this outcome in some situations?
		}
		// What are we skipping?
		i = dumbfile_igetw(f);
		if (dumbfile_error(f) || dumbfile_skip(f, 8*i)) {
			free(component);
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}
		/* Read embedded MIDI configuration */
		// What are the first 9 commands for?
		if (dumbfile_skip(f, 32*9)) {
			free(component);
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}
		for (i = 0; i < 16; i++) {
			unsigned char len = 0;
			int j, leftdigit = -1;
            if (dumbfile_getnc((char *)mididata, 32, f) < 32) {
				free(component);
				_dumb_it_unload_sigdata(sigdata);
				return NULL;
			}
			sigdata->midi->SFmacroz[i] = 0;
			for (j = 0; j < 32; j++) {
				if (leftdigit >= 0) {
					if (mididata[j] == 0) {
						sigdata->midi->SFmacro[i][len++] = leftdigit;
						break;
					} else if (mididata[j] == ' ')
						sigdata->midi->SFmacro[i][len++] = leftdigit;
					else if (mididata[j] >= '0' && mididata[j] <= '9')
						sigdata->midi->SFmacro[i][len++] = (leftdigit << 4) | (mididata[j] - '0');
					else if (mididata[j] >= 'A' && mididata[j] <= 'F')
						sigdata->midi->SFmacro[i][len++] = (leftdigit << 4) | (mididata[j] - 'A' + 0xA);
					leftdigit = -1;
				} else if (mididata[j] == 0)
					break;
				else if (mididata[j] == 'z')
					sigdata->midi->SFmacroz[i] |= 1 << len++;
				else if (mididata[j] >= '0' && mididata[j] <= '9')
					leftdigit = mididata[j] - '0';
				else if (mididata[j] >= 'A' && mididata[j] <= 'F')
					leftdigit = mididata[j] - 'A' + 0xA;
			}
			sigdata->midi->SFmacrolen[i] = len;
		}
		for (i = 0; i < 128; i++) {
			unsigned char len = 0;
			int j, leftdigit = -1;
            dumbfile_getnc((char *)mididata, 32, f);
			for (j = 0; j < 32; j++) {
				if (leftdigit >= 0) {
					if (mididata[j] == 0) {
						sigdata->midi->Zmacro[i][len++] = leftdigit;
						break;
					} else if (mididata[j] == ' ')
						sigdata->midi->Zmacro[i][len++] = leftdigit;
					else if (mididata[j] >= '0' && mididata[j] <= '9')
						sigdata->midi->Zmacro[i][len++] = (leftdigit << 4) | (mididata[j] - '0');
					else if (mididata[j] >= 'A' && mididata[j] <= 'F')
						sigdata->midi->Zmacro[i][len++] = (leftdigit << 4) | (mididata[j] - 'A' + 0xA);
					leftdigit = -1;
				} else if (mididata[j] == 0)
					break;
				else if (mididata[j] >= '0' && mididata[j] <= '9')
					leftdigit = mididata[j] - '0';
				else if (mididata[j] >= 'A' && mididata[j] <= 'F')
					leftdigit = mididata[j] - 'A' + 0xA;
			}
			sigdata->midi->Zmacrolen[i] = len;
		}
	}

	sigdata->flags &= IT_REAL_FLAGS;

    qsort(component, n_components, sizeof(IT_COMPONENT), &it_component_compare);

	buffer = malloc(65536);
	if (!buffer) {
		free(component);
		_dumb_it_unload_sigdata(sigdata);
		return NULL;
	}

	for (n = 0; n < n_components; n++) {
		int32 offset;
		int m;

		/* XXX */
		if ( component[n].offset == 0 ) {
			switch (component[n].type) {
				case IT_COMPONENT_INSTRUMENT:
					memset( &sigdata->instrument[component[n].n], 0, sizeof(IT_INSTRUMENT) );
					break;
				case IT_COMPONENT_SAMPLE:
					memset( &sigdata->sample[component[n].n], 0, sizeof(IT_SAMPLE) );
					break;
				case IT_COMPONENT_PATTERN:
					{
						IT_PATTERN * p = &sigdata->pattern[component[n].n];
						p->entry = 0;
						p->n_rows = 64;
						p->n_entries = 0;
					}
					break;
			}
			continue;
		}

        if (dumbfile_seek(f, component[n].offset, DFS_SEEK_SET)) {
			free(buffer);
			free(component);
			_dumb_it_unload_sigdata(sigdata);
			return NULL;
		}

		switch (component[n].type) {

			case IT_COMPONENT_SONG_MESSAGE:
				if ( n < n_components ) {
					message_length = min( message_length, component[n+1].offset - component[n].offset );
				}
				sigdata->song_message = malloc(message_length + 1);
				if (sigdata->song_message) {
                    if (dumbfile_getnc((char *)sigdata->song_message, message_length, f) < message_length) {
						free(buffer);
						free(component);
						_dumb_it_unload_sigdata(sigdata);
						return NULL;
					}
					sigdata->song_message[message_length] = 0;
				}
				break;

			case IT_COMPONENT_INSTRUMENT:
				if (cmwt < 0x200)
					m = it_read_old_instrument(&sigdata->instrument[component[n].n], f);
				else
					m = it_read_instrument(&sigdata->instrument[component[n].n], f, (n + 1 < n_components) ? (component[n+1].offset - component[n].offset) : 0);

				if (m) {
					free(buffer);
					free(component);
					_dumb_it_unload_sigdata(sigdata);
					return NULL;
				}
				break;

			case IT_COMPONENT_PATTERN:
				if (it_read_pattern(&sigdata->pattern[component[n].n], f, buffer)) {
					free(buffer);
					free(component);
					_dumb_it_unload_sigdata(sigdata);
					return NULL;
				}
				break;

			case IT_COMPONENT_SAMPLE:
				if (it_read_sample_header(&sigdata->sample[component[n].n], &sample_convert[component[n].n], &offset, f)) {
					free(buffer);
					free(component);
					_dumb_it_unload_sigdata(sigdata);
					return NULL;
				}

				if (sigdata->sample[component[n].n].flags & IT_SAMPLE_EXISTS) {
					short *sample;

					for (m = n + 1; m < n_components; m++)
						if (component[m].offset > offset)
							break;
					m--;

					sample = &component[m].sampfirst;

					while (*sample >= 0 && component[*sample].offset <= offset)
						sample = &component[*sample].sampnext;

					component[n].sampnext = *sample;
					*sample = n;

					component[n].offset = offset;
				}
		}

		m = component[n].sampfirst;

		while (m >= 0) {
            if (dumbfile_seek(f, component[m].offset, DFS_SEEK_SET)) {
				free(buffer);
				free(component);
				_dumb_it_unload_sigdata(sigdata);
				return NULL;
			}

			if (it_read_sample_data(&sigdata->sample[component[m].n], sample_convert[component[m].n], f)) {
				free(buffer);
				free(component);
				_dumb_it_unload_sigdata(sigdata);
				return NULL;
			}

			m = component[m].sampnext;
		}
    }

    for ( n = 0; n < 10; n++ )
    {
        if ( dumbfile_getc( f ) == 'X' )
        {
            if ( dumbfile_getc( f ) == 'T' )
            {
                if ( dumbfile_getc( f ) == 'P' )
                {
                    if ( dumbfile_getc( f ) == 'M' )
                    {
                        break;
                    }
                }
            }
        }
    }

    if ( !dumbfile_error( f ) && n < 10 )
    {
        unsigned int mptx_id = dumbfile_igetl( f );
        while ( !dumbfile_error( f ) && mptx_id != DUMB_ID('M','P','T','S') )
        {
            unsigned int size = dumbfile_igetw( f );
            switch (mptx_id)
            {
            /* TODO: Add instrument extension readers */

            default:
                dumbfile_skip(f, size * sigdata->n_instruments);
                break;
            }

            mptx_id = dumbfile_igetl( f );
        }

        mptx_id = dumbfile_igetl( f );
        while ( !dumbfile_error(f) && dumbfile_pos(f) < dumbfile_get_size(f) )
        {
            unsigned int size = dumbfile_igetw( f );
            switch (mptx_id)
            {
            /* TODO: Add more song extension readers */

            case DUMB_ID('D','T','.','.'):
                if ( size == 2 )
                    sigdata->tempo = dumbfile_igetw( f );
                else if ( size == 4 )
                    sigdata->tempo = dumbfile_igetl( f );
                break;

            default:
                dumbfile_skip(f, size);
                break;
            }
            mptx_id = dumbfile_igetl( f );
        }
    }

    free(buffer);
	free(component);

	_dumb_it_fix_invalid_orders(sigdata);

	return sigdata;
}